

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void opj_j2k_destroy(opj_j2k_t *p_j2k)

{
  OPJ_BYTE *pOVar1;
  void *ptr;
  int iVar2;
  opj_tcp_t *poVar3;
  long lVar4;
  OPJ_UINT32 i;
  ulong uVar5;
  bool bVar6;
  
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_j2k->m_is_decoder == 0) {
      pOVar1 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
      }
      pOVar1 = (p_j2k->m_specific_param).m_decoder.m_header_data;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
      }
      pOVar1 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
      }
    }
    else {
      poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      if (poVar3 != (opj_tcp_t *)0x0) {
        opj_j2k_tcp_destroy(poVar3);
        opj_free((p_j2k->m_specific_param).m_decoder.m_default_tcp);
        (p_j2k->m_specific_param).m_decoder.m_default_tcp = (opj_tcp_t *)0x0;
      }
      pOVar1 = (p_j2k->m_specific_param).m_decoder.m_header_data;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
      }
      opj_free((p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode);
      (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode = (OPJ_UINT32 *)0x0;
      (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode = 0;
    }
    opj_tcd_destroy(p_j2k->m_tcd);
    poVar3 = (p_j2k->m_cp).tcps;
    if (poVar3 != (opj_tcp_t *)0x0) {
      iVar2 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
      while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
        opj_j2k_tcp_destroy(poVar3);
        poVar3 = poVar3 + 1;
      }
      opj_free((p_j2k->m_cp).tcps);
      (p_j2k->m_cp).tcps = (opj_tcp_t *)0x0;
    }
    if ((p_j2k->m_cp).ppm_markers != (opj_ppx *)0x0) {
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < (p_j2k->m_cp).ppm_markers_count; uVar5 = uVar5 + 1) {
        ptr = *(void **)((long)&((p_j2k->m_cp).ppm_markers)->m_data + lVar4);
        if (ptr != (void *)0x0) {
          opj_free(ptr);
        }
        lVar4 = lVar4 + 0x10;
      }
      (p_j2k->m_cp).ppm_markers_count = 0;
      opj_free((p_j2k->m_cp).ppm_markers);
      (p_j2k->m_cp).ppm_markers = (opj_ppx *)0x0;
    }
    opj_free((p_j2k->m_cp).ppm_buffer);
    (p_j2k->m_cp).ppm_buffer = (OPJ_BYTE *)0x0;
    (p_j2k->m_cp).ppm_data = (OPJ_BYTE *)0x0;
    opj_free((p_j2k->m_cp).comment);
    (p_j2k->m_cp).comment = (OPJ_CHAR *)0x0;
    if (((p_j2k->m_cp).field_0x90 & 2) == 0) {
      opj_free((p_j2k->m_cp).m_specific_param.m_enc.m_matrice);
    }
    memset(&p_j2k->m_cp,0,0x98);
    opj_procedure_list_destroy(p_j2k->m_procedure_list);
    p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
    opj_procedure_list_destroy(p_j2k->m_validation_list);
    p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
    j2k_destroy_cstr_index(p_j2k->cstr_index);
    p_j2k->cstr_index = (opj_codestream_index_t *)0x0;
    opj_image_destroy(p_j2k->m_private_image);
    p_j2k->m_private_image = (opj_image_t *)0x0;
    opj_image_destroy(p_j2k->m_output_image);
    p_j2k->m_output_image = (opj_image_t *)0x0;
    opj_thread_pool_destroy(p_j2k->m_tp);
    p_j2k->m_tp = (opj_thread_pool_t *)0x0;
    opj_free(p_j2k);
    return;
  }
  return;
}

Assistant:

void opj_j2k_destroy(opj_j2k_t *p_j2k)
{
    if (p_j2k == 00) {
        return;
    }

    if (p_j2k->m_is_decoder) {

        if (p_j2k->m_specific_param.m_decoder.m_default_tcp != 00) {
            opj_j2k_tcp_destroy(p_j2k->m_specific_param.m_decoder.m_default_tcp);
            opj_free(p_j2k->m_specific_param.m_decoder.m_default_tcp);
            p_j2k->m_specific_param.m_decoder.m_default_tcp = 00;
        }

        if (p_j2k->m_specific_param.m_decoder.m_header_data != 00) {
            opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
            p_j2k->m_specific_param.m_decoder.m_header_data = 00;
            p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
        }

        opj_free(p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode);
        p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode = 00;
        p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode = 0;

    } else {

        if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);
            p_j2k->m_specific_param.m_encoder.m_encoded_tile_data = 00;
        }

        if (p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer);
            p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer = 00;
            p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current = 00;
        }

        if (p_j2k->m_specific_param.m_encoder.m_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = 00;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
        }
    }

    opj_tcd_destroy(p_j2k->m_tcd);

    opj_j2k_cp_destroy(&(p_j2k->m_cp));
    memset(&(p_j2k->m_cp), 0, sizeof(opj_cp_t));

    opj_procedure_list_destroy(p_j2k->m_procedure_list);
    p_j2k->m_procedure_list = 00;

    opj_procedure_list_destroy(p_j2k->m_validation_list);
    p_j2k->m_procedure_list = 00;

    j2k_destroy_cstr_index(p_j2k->cstr_index);
    p_j2k->cstr_index = NULL;

    opj_image_destroy(p_j2k->m_private_image);
    p_j2k->m_private_image = NULL;

    opj_image_destroy(p_j2k->m_output_image);
    p_j2k->m_output_image = NULL;

    opj_thread_pool_destroy(p_j2k->m_tp);
    p_j2k->m_tp = NULL;

    opj_free(p_j2k);
}